

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O2

bool __thiscall
ritobin::io::impl_binary_read::BinBinaryReader::read_value_visit
          (BinBinaryReader *this,Pointer *value)

{
  uint *puVar1;
  uint *puVar2;
  BinaryReader *this_00;
  bool bVar3;
  byte bVar4;
  ssize_t sVar5;
  reference pvVar6;
  long lVar7;
  size_t in_RCX;
  ulong __nbytes;
  void *in_RDX;
  uint *pos;
  void *__buf;
  void *__buf_00;
  char *pcVar8;
  char *msg;
  ulong uVar9;
  long lVar10;
  Type type;
  Type local_51;
  char *local_50;
  ulong local_48;
  uint *local_40;
  BinaryReader *local_38;
  
  local_38 = &this->reader;
  pos = (uint *)(this->reader).cur_;
  sVar5 = BinaryReader::read(local_38,(int)value,in_RDX,in_RCX);
  this_00 = local_38;
  if ((char)sVar5 == '\0') {
    pcVar8 = "reader.read(value.name)";
  }
  else {
    if ((value->name).hash_ == 0) {
      bVar4 = 1;
LAB_001145bb:
      return (bool)(bVar4 & 1);
    }
    puVar1 = (uint *)(this->reader).cur_;
    puVar2 = (uint *)(this->reader).cap_;
    pos = puVar1 + 1;
    if (puVar2 < pos) {
      pcVar8 = "reader.read(size)";
      pos = puVar1;
    }
    else {
      __nbytes = (ulong)*puVar1;
      (this->reader).cur_ = (char *)pos;
      local_48 = __nbytes;
      if ((uint *)((long)puVar1 + 6) <= puVar2) {
        local_50 = (this->reader).beg_;
        uVar9 = (ulong)(ushort)*pos;
        (this->reader).cur_ = (char *)((long)puVar1 + 6);
        local_40 = pos;
        do {
          bVar3 = uVar9 == 0;
          uVar9 = uVar9 - 1;
          if (bVar3) {
            pcVar8 = (this->reader).cur_;
            lVar10 = (long)pcVar8 - (long)(this->reader).beg_;
            lVar7 = (long)local_40 + (local_48 - (long)local_50);
            if (lVar10 != lVar7) {
              bVar3 = fail_msg(this,"reader.position() == position + size",pcVar8);
              __nbytes = (ulong)bVar3;
            }
            bVar4 = lVar10 == lVar7 | (byte)__nbytes;
            goto LAB_001145bb;
          }
          pvVar6 = std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>::emplace_back<>
                             (&value->items);
          local_51 = NONE;
          pcVar8 = (this->reader).cur_;
          sVar5 = BinaryReader::read(this_00,(int)pvVar6,__buf,__nbytes);
          if ((char)sVar5 == '\0') {
            msg = "reader.read(name)";
            goto LAB_001145b0;
          }
          pcVar8 = (this->reader).cur_;
          sVar5 = BinaryReader::read(this_00,(int)&local_51,__buf_00,__nbytes);
          if ((char)sVar5 == '\0') {
            msg = "reader.read(type)";
            goto LAB_001145b0;
          }
          pcVar8 = (this->reader).cur_;
          bVar3 = read_value_of(this,&pvVar6->value,local_51);
        } while (bVar3);
        msg = "read_value_of(item, type)";
LAB_001145b0:
        bVar4 = fail_msg(this,msg,pcVar8);
        goto LAB_001145bb;
      }
      pcVar8 = "reader.read(count)";
    }
  }
  bVar3 = fail_msg(this,pcVar8,(char *)pos);
  return bVar3;
}

Assistant:

bool read_value_visit(Pointer& value) noexcept {
            uint32_t size = 0;
            uint16_t count = 0;
            bin_assert(reader.read(value.name));
            if (value.name.hash() == 0) {
                return true;
            }
            bin_assert(reader.read(size));
            size_t position = reader.position();
            bin_assert(reader.read(count));
            for (size_t i = 0; i != count; i++) {
                auto& [name, item] = value.items.emplace_back();
                Type type = {};
                bin_assert(reader.read(name));
                bin_assert(reader.read(type));
                bin_assert(read_value_of(item, type));
            }
            bin_assert(reader.position() == position + size);
            return true;
        }